

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O0

void __thiscall
Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::DynamicType>_>::WriteBarrierSet
          (WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::DynamicType>_> *this,
          RecyclerWeakReference<Js::DynamicType> *ptr)

{
  RecyclerWeakReference<Js::DynamicType> *ptr_local;
  WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::DynamicType>_> *this_local;
  
  Recycler::WBSetBit((char *)this);
  NoWriteBarrierSet(this,ptr);
  RecyclerWriteBarrierManager::WriteBarrier(this);
  return;
}

Assistant:

void WriteBarrierSet(T * ptr)
    {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
        // set the verification bits before updating the reference so it's ready to verify while background marking hit the reference
        Recycler::WBSetBit((char*)this);
#endif

        NoWriteBarrierSet(ptr);

#ifdef RECYCLER_WRITE_BARRIER
        // set the barrier bit after updating the reference to prevent a race issue that background thread is resetting all the dirty pages
        RecyclerWriteBarrierManager::WriteBarrier(this);
#endif
    }